

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::
       tuple_caster<std::tuple,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
       ::
       cast_impl<std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&,0ul,1ul,2ul,3ul,4ul>
                 (tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>
                  *src,return_value_policy policy,handle parent)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  __tuple_element_t<0UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var4;
  type tVar5;
  __tuple_element_t<1UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var6;
  __tuple_element_t<2UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *p_Var7;
  handle hVar8;
  __tuple_element_t<3UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *src_00;
  __tuple_element_t<4UL,_tuple<unsigned_int,_unsigned_int,_bool,_PortDirection,_PortType>_> *src_01;
  iterator pvVar9;
  PyObject **ppPVar10;
  handle local_120;
  iterator local_118;
  value_type *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_5UL> *__range3_1;
  int counter;
  tuple result;
  value_type *entry;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_5UL> *__range3;
  undefined1 local_58 [8];
  array<pybind11::object,_5UL> entries;
  return_value_policy policy_local;
  tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType> *src_local;
  handle parent_local;
  
  entries._M_elems[4].super_handle.m_ptr._7_1_ = policy;
  p_Var4 = std::get<0ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>(src);
  tVar5 = type_caster<unsigned_int,_void>::cast<unsigned_int>
                    (*p_Var4,entries._M_elems[4].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)local_58,(handle)tVar5.m_ptr);
  p_Var6 = std::get<1ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>(src);
  tVar5 = type_caster<unsigned_int,_void>::cast<unsigned_int>
                    (*p_Var6,entries._M_elems[4].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)&entries,(handle)tVar5.m_ptr);
  p_Var7 = std::get<2ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>(src);
  hVar8 = type_caster<bool,_void>::cast
                    ((bool)(*p_Var7 & 1),entries._M_elems[4].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)(entries._M_elems + 1),hVar8);
  src_00 = std::get<3ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>(src);
  hVar8 = type_caster_base<kratos::PortDirection>::cast
                    (src_00,entries._M_elems[4].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)(entries._M_elems + 2),hVar8);
  src_01 = std::get<4ul,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>(src);
  hVar8 = type_caster_base<kratos::PortType>::cast
                    (src_01,entries._M_elems[4].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)(entries._M_elems + 3),hVar8);
  __end0 = std::array<pybind11::object,_5UL>::begin((array<pybind11::object,_5UL> *)local_58);
  pvVar9 = std::array<pybind11::object,_5UL>::end((array<pybind11::object,_5UL> *)local_58);
  do {
    if (__end0 == pvVar9) {
      pybind11::tuple::tuple<unsigned_long,_0>((tuple *)&stack0xffffffffffffff10,5);
      __range3_1._4_4_ = 0;
      __begin0_1 = (iterator)local_58;
      __end0_1 = std::array<pybind11::object,_5UL>::begin
                           ((array<pybind11::object,_5UL> *)__begin0_1);
      entry_1 = std::array<pybind11::object,_5UL>::end((array<pybind11::object,_5UL> *)__begin0_1);
      for (; __end0_1 != entry_1; __end0_1 = __end0_1 + 1) {
        local_118 = __end0_1;
        local_120 = object::release(__end0_1);
        ppPVar10 = pybind11::handle::ptr(&local_120);
        pPVar1 = (PyTypeObject *)*ppPVar10;
        ppPVar10 = pybind11::handle::ptr((handle *)&stack0xffffffffffffff10);
        iVar3 = ::PyType_HasFeature((*ppPVar10)->ob_type,0x4000000);
        if (iVar3 == 0) {
          __assert_fail("PyTuple_Check(result.ptr())",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                        ,0x280,
                        "static handle pybind11::detail::tuple_caster<std::tuple, unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType>, T = const std::tuple<unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType> &, Is = <0UL, 1UL, 2UL, 3UL, 4UL>]"
                       );
        }
        ppPVar10 = pybind11::handle::ptr((handle *)&stack0xffffffffffffff10);
        (&(*ppPVar10)[1].ob_type)[__range3_1._4_4_] = pPVar1;
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
      }
      parent_local = object::release((object *)&stack0xffffffffffffff10);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      pybind11::tuple::~tuple((tuple *)&stack0xffffffffffffff10);
LAB_0079ed61:
      std::array<pybind11::object,_5UL>::~array((array<pybind11::object,_5UL> *)local_58);
      return (handle)parent_local.m_ptr;
    }
    bVar2 = pybind11::handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) {
      memset(&parent_local,0,8);
      pybind11::handle::handle(&parent_local);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      goto LAB_0079ed61;
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(src, policy, parent);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(policy, parent);
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }